

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.hpp
# Opt level: O0

void __thiscall
diy::stats::DurationAccumulator::output(DurationAccumulator *this,ostream *out,string *prefix)

{
  bool bVar1;
  ulong uVar2;
  ostream *out_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true>
  d;
  reference pvVar3;
  ostream *poVar4;
  string *in_RDX;
  ostream *in_RSI;
  long in_RDI;
  value_type *x;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  *__range2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  string *this_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true>
  local_30;
  
  this_00 = in_RDX;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=(in_RDX," ");
  }
  out_00 = (ostream *)(in_RDI + 0x38);
  d._M_cur = (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
             ::begin(in_stack_ffffffffffffffa8);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
       ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true>
                        *)&stack0xffffffffffffffd8,&local_30);
    if (!bVar1) break;
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_false,_true>
             ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_false,_true>
                          *)0x17b124);
    std::operator<<(in_RSI,in_RDX);
    poVar4 = operator<<(out_00,(duration *)d._M_cur);
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = std::operator<<(poVar4,(string *)pvVar3);
    std::operator<<(poVar4,'\n');
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_false,_true>
                  *)this_00);
  }
  return;
}

Assistant:

void    output(std::ostream& out, std::string prefix = "") const
    {
        if (!prefix.empty())
            prefix += " ";

        for (auto& x : duration)
            out << prefix << x.second << ' ' << x.first << '\n';
    }